

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::IsPathToFramework(string *path)

{
  string_view str;
  bool bVar1;
  bool local_21;
  string *path_local;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  local_21 = false;
  if (bVar1) {
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)path);
    local_21 = cmHasLiteralSuffix<11ul>(str,(char (*) [11])".framework");
  }
  return local_21;
}

Assistant:

bool cmSystemTools::IsPathToFramework(const std::string& path)
{
  return (cmSystemTools::FileIsFullPath(path) &&
          cmHasLiteralSuffix(path, ".framework"));
}